

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

char * show_token_sequence(dmr_C *C,token *token,int quote)

{
  int iVar1;
  size_t sVar2;
  char *local_50;
  int len;
  char *val;
  char *pcStack_30;
  int whitespace;
  char *ptr;
  token *ptStack_20;
  int quote_local;
  token *token_local;
  dmr_C *C_local;
  
  pcStack_30 = C->preprocessor_buffer;
  val._4_4_ = 0;
  ptStack_20 = token;
  if ((token == (token *)0x0) && (quote == 0)) {
    C_local = (dmr_C *)anon_var_dwarf_25357;
  }
  else {
    while (ptStack_20 != &dmrC_eof_token_entry_) {
      if (quote == 0) {
        local_50 = dmrC_show_token(C,ptStack_20);
      }
      else {
        local_50 = dmrC_quote_token(C,ptStack_20);
      }
      sVar2 = strlen(local_50);
      iVar1 = (int)sVar2;
      if (C->preprocessor_mergebuffer <= pcStack_30 + (long)iVar1 + (long)(int)val._4_4_) {
        dmrC_sparse_error(C,ptStack_20->pos,"too long token expansion");
        break;
      }
      if (val._4_4_ != 0) {
        *pcStack_30 = ' ';
        pcStack_30 = pcStack_30 + 1;
      }
      memcpy(pcStack_30,local_50,(long)iVar1);
      pcStack_30 = pcStack_30 + iVar1;
      ptStack_20 = ptStack_20->next;
      val._4_4_ = (uint)((ulong)ptStack_20->pos >> 0x15) & 1;
    }
    *pcStack_30 = '\0';
    C_local = (dmr_C *)C->preprocessor_buffer;
  }
  return (char *)C_local;
}

Assistant:

static const char *show_token_sequence(struct dmr_C *C, struct token *token, int quote)
{
	char *ptr = C->preprocessor_buffer;
	int whitespace = 0;

	if (!token && !quote)
		return "<none>";
	while (!dmrC_eof_token(token)) {
		const char *val = quote ? dmrC_quote_token(C, token) : dmrC_show_token(C, token);
		int len = (int) strlen(val);

		if (ptr + whitespace + len >= C->preprocessor_buffer + sizeof C->preprocessor_buffer) {
			dmrC_sparse_error(C, token->pos, "too long token expansion");
			break;
		}

		if (whitespace)
			*ptr++ = ' ';
		memcpy(ptr, val, len);
		ptr += len;
		token = token->next;
		whitespace = token->pos.whitespace;
	}
	*ptr = 0;
	return C->preprocessor_buffer;
}